

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_pruneL.h
# Opt level: O0

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::pruneL
          (SparseLUImpl<double,_int> *this,int jcol,IndexVector *perm_r,int pivrow,int nseg,
          IndexVector *segrep,BlockIndexVector *repfnz,IndexVector *xprune,GlobalLU_t *glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  Scalar *pSVar9;
  CoeffReturnType piVar10;
  Scalar *pSVar11;
  Scalar *__b;
  Scalar *__a;
  Scalar *__b_00;
  int local_58;
  int krow;
  int maxloc;
  int minloc;
  int kmax;
  int kmin;
  bool do_prune;
  bool movnum;
  int irep1;
  int irep;
  int i;
  int jsupno;
  IndexVector *segrep_local;
  int nseg_local;
  int pivrow_local;
  IndexVector *perm_r_local;
  int jcol_local;
  SparseLUImpl<double,_int> *this_local;
  
  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                      (long)jcol);
  iVar1 = *pSVar9;
  minloc = 0;
  maxloc = 0;
  irep1 = 0;
  do {
    if (nseg <= irep1) {
      return;
    }
    piVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)segrep,
                         (long)irep1);
    iVar2 = *piVar10;
    iVar8 = iVar2 + 1;
    bVar7 = false;
    pSVar11 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                            *)repfnz,(long)iVar2);
    if (*pSVar11 != -1) {
      pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                          (long)iVar2);
      iVar3 = *pSVar9;
      pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                          (long)iVar8);
      if ((iVar3 != *pSVar9) &&
         (pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno
                              ,(long)iVar2), *pSVar9 != iVar1)) {
        pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xprune,
                            (long)iVar2);
        iVar3 = *pSVar9;
        pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                            (long)iVar8);
        if (*pSVar9 <= iVar3) {
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub
                              ,(long)iVar2);
          minloc = *pSVar9;
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub
                              ,(long)iVar8);
          maxloc = *pSVar9 + -1;
          for (local_58 = minloc; local_58 <= maxloc; local_58 = local_58 + 1) {
            pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                &glu->lsub,(long)local_58);
            if (*pSVar9 == pivrow) {
              bVar7 = true;
              break;
            }
          }
        }
        if (bVar7) {
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno
                              ,(long)iVar2);
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                              (long)*pSVar9);
          iVar8 = *pSVar9;
          while (minloc <= maxloc) {
            pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                &glu->lsub,(long)maxloc);
            piVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)perm_r,
                                 (long)*pSVar9);
            if (*piVar10 == -1) {
              maxloc = maxloc + -1;
            }
            else {
              pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                  &glu->lsub,(long)minloc);
              piVar10 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)perm_r
                                   ,(long)*pSVar9);
              if (*piVar10 == -1) {
                pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                    &glu->lsub,(long)minloc);
                __b = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                 &glu->lsub,(long)maxloc);
                std::swap<int>(pSVar9,__b);
                if (iVar2 == iVar8) {
                  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                      &glu->xlusup,(long)iVar2);
                  iVar3 = *pSVar9;
                  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                      &glu->xlsub,(long)iVar2);
                  iVar4 = *pSVar9;
                  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                      &glu->xlusup,(long)iVar2);
                  iVar5 = *pSVar9;
                  pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                      &glu->xlsub,(long)iVar2);
                  iVar6 = *pSVar9;
                  __a = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   &glu->lusup,(long)(iVar3 + (minloc - iVar4)));
                  __b_00 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                      &glu->lusup,(long)(iVar5 + (maxloc - iVar6)));
                  std::swap<double>(__a,__b_00);
                }
                maxloc = maxloc + -1;
              }
              minloc = minloc + 1;
            }
          }
          pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)xprune,
                              (long)iVar2);
          *pSVar9 = minloc;
        }
      }
    }
    irep1 = irep1 + 1;
  } while( true );
}

Assistant:

void SparseLUImpl<Scalar,Index>::pruneL(const Index jcol, const IndexVector& perm_r, const Index pivrow, const Index nseg, const IndexVector& segrep, BlockIndexVector repfnz, IndexVector& xprune, GlobalLU_t& glu)
{
  // For each supernode-rep irep in U(*,j]
  Index jsupno = glu.supno(jcol); 
  Index i,irep,irep1; 
  bool movnum, do_prune = false; 
  Index kmin = 0, kmax = 0, minloc, maxloc,krow; 
  for (i = 0; i < nseg; i++)
  {
    irep = segrep(i); 
    irep1 = irep + 1; 
    do_prune = false; 
    
    // Don't prune with a zero U-segment 
    if (repfnz(irep) == emptyIdxLU) continue; 
    
    // If a snode overlaps with the next panel, then the U-segment
    // is fragmented into two parts -- irep and irep1. We should let 
    // pruning occur at the rep-column in irep1s snode. 
    if (glu.supno(irep) == glu.supno(irep1) ) continue; // don't prune 
    
    // If it has not been pruned & it has a nonz in row L(pivrow,i)
    if (glu.supno(irep) != jsupno )
    {
      if ( xprune (irep) >= glu.xlsub(irep1) )
      {
        kmin = glu.xlsub(irep);
        kmax = glu.xlsub(irep1) - 1; 
        for (krow = kmin; krow <= kmax; krow++)
        {
          if (glu.lsub(krow) == pivrow) 
          {
            do_prune = true; 
            break; 
          }
        }
      }
      
      if (do_prune) 
      {
        // do a quicksort-type partition
        // movnum=true means that the num values have to be exchanged
        movnum = false; 
        if (irep == glu.xsup(glu.supno(irep)) ) // Snode of size 1 
          movnum = true; 
        
        while (kmin <= kmax)
        {
          if (perm_r(glu.lsub(kmax)) == emptyIdxLU)
            kmax--; 
          else if ( perm_r(glu.lsub(kmin)) != emptyIdxLU)
            kmin++;
          else 
          {
            // kmin below pivrow (not yet pivoted), and kmax
            // above pivrow: interchange the two suscripts
            std::swap(glu.lsub(kmin), glu.lsub(kmax)); 
            
            // If the supernode has only one column, then we 
            // only keep one set of subscripts. For any subscript
            // intercnahge performed, similar interchange must be 
            // done on the numerical values. 
            if (movnum) 
            {
              minloc = glu.xlusup(irep) + ( kmin - glu.xlsub(irep) ); 
              maxloc = glu.xlusup(irep) + ( kmax - glu.xlsub(irep) ); 
              std::swap(glu.lusup(minloc), glu.lusup(maxloc)); 
            }
            kmin++;
            kmax--;
          }
        } // end while 
        
        xprune(irep) = kmin;  //Pruning 
      } // end if do_prune 
    } // end pruning 
  } // End for each U-segment
}